

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
protozero::ScatteredStreamWriter::WriteBytesSlowPath
          (ScatteredStreamWriter *this,uint8_t *src,size_t size)

{
  uint8_t *puVar1;
  uint8_t *__dest;
  int iVar2;
  undefined4 extraout_var;
  uint8_t *extraout_RDX;
  ulong __n;
  
  if (size != 0) {
    do {
      if ((this->cur_range_).end <= this->write_ptr_) {
        iVar2 = (*this->delegate_->_vptr_Delegate[2])();
        this->written_previously_ =
             (uint64_t)
             (this->write_ptr_ + (this->written_previously_ - (long)(this->cur_range_).begin));
        (this->cur_range_).begin = (uint8_t *)CONCAT44(extraout_var,iVar2);
        (this->cur_range_).end = extraout_RDX;
        this->write_ptr_ = (uint8_t *)CONCAT44(extraout_var,iVar2);
      }
      puVar1 = (this->cur_range_).end;
      __dest = this->write_ptr_;
      __n = (long)puVar1 - (long)__dest;
      if (size < __n) {
        __n = size;
      }
      if (puVar1 < __dest + __n) {
        __assert_fail("end <= cur_range_.end",
                      "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.h"
                      ,0x6c2,
                      "void protozero::ScatteredStreamWriter::WriteBytesUnsafe(const uint8_t *, size_t)"
                     );
      }
      memcpy(__dest,src,__n);
      this->write_ptr_ = __dest + __n;
      src = src + __n;
      size = size - __n;
    } while (size != 0);
  }
  return;
}

Assistant:

void ScatteredStreamWriter::WriteBytesSlowPath(const uint8_t* src,
                                               size_t size) {
  size_t bytes_left = size;
  while (bytes_left > 0) {
    if (write_ptr_ >= cur_range_.end)
      Extend();
    const size_t burst_size = std::min(bytes_available(), bytes_left);
    WriteBytesUnsafe(src, burst_size);
    bytes_left -= burst_size;
    src += burst_size;
  }
}